

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
ipx::Model::EvaluateBasicSolution
          (Model *this,Vector *x_solver,Vector *y_solver,Vector *z_solver,
          vector<int,_std::allocator<int>_> *basic_status_solver,Info *info)

{
  double dVar1;
  double *pdVar2;
  reference pvVar3;
  const_reference pvVar4;
  Vector *x_00;
  Model *in_RDI;
  long in_R9;
  vector<int,_std::allocator<int>_> *this_00;
  Int i;
  Int j;
  Vector zinfeas;
  Vector yinfeas;
  Vector sinfeas;
  Vector xinfeas;
  double pobj;
  vector<int,_std::allocator<int>_> vbasis;
  vector<int,_std::allocator<int>_> cbasis;
  Vector z;
  Vector y;
  Vector slack;
  Vector x;
  Int n;
  Int m;
  size_t in_stack_fffffffffffffce8;
  undefined1 *__n;
  valarray<double> *in_stack_fffffffffffffcf0;
  valarray<double> *this_01;
  allocator_type *in_stack_fffffffffffffd00;
  Vector *in_stack_fffffffffffffd08;
  Vector *in_stack_fffffffffffffd10;
  Vector *in_stack_fffffffffffffd18;
  Vector *in_stack_fffffffffffffd20;
  Vector *in_stack_fffffffffffffd28;
  Model *in_stack_fffffffffffffd30;
  Vector *in_stack_fffffffffffffd38;
  Model *in_stack_fffffffffffffd40;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd48;
  double dVar5;
  Model *in_stack_fffffffffffffd50;
  Vector *in_stack_fffffffffffffd98;
  Vector *in_stack_fffffffffffffda0;
  Vector *in_stack_fffffffffffffda8;
  Vector *in_stack_fffffffffffffdb0;
  Vector *in_stack_fffffffffffffdb8;
  Model *in_stack_fffffffffffffdc0;
  Vector *in_stack_fffffffffffffdd0;
  Vector *in_stack_fffffffffffffdd8;
  vector<int,_std::allocator<int>_> *local_168;
  double local_160;
  double local_158;
  double local_150;
  int local_148;
  int local_144;
  valarray<double> local_140;
  valarray<double> local_130;
  valarray<double> local_120;
  valarray<double> local_110;
  double local_100;
  undefined1 local_f8 [56];
  vector<int,_std::allocator<int>_> local_c0 [2];
  valarray<double> local_88;
  valarray<double> local_78 [2];
  valarray<double> local_58;
  valarray<double> local_48;
  Int local_38;
  Int local_34;
  long local_30;
  
  local_30 = in_R9;
  local_34 = rows(in_RDI);
  local_38 = cols(in_RDI);
  std::valarray<double>::valarray(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::valarray<double>::valarray(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::valarray<double>::valarray(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::valarray<double>::valarray(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::allocator<int>::allocator((allocator<int> *)0x84883b);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd10,
             (size_type)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::allocator<int>::~allocator((allocator<int> *)0x848867);
  std::allocator<int>::allocator((allocator<int> *)0x848893);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd10,
             (size_type)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::allocator<int>::~allocator((allocator<int> *)0x8488bf);
  this_01 = &local_88;
  DualizeBackBasicSolution
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
             in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8);
  DualizeBackBasis(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd38);
  __n = local_f8;
  CorrectScaledBasicSolution
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(Vector *)in_stack_fffffffffffffd30
             ,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd18,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00);
  local_100 = Dot(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::valarray<double>::valarray(this_01,(size_t)__n);
  std::valarray<double>::valarray(this_01,(size_t)__n);
  std::valarray<double>::valarray(this_01,(size_t)__n);
  std::valarray<double>::valarray(this_01,(size_t)__n);
  for (local_144 = 0; local_144 < in_RDI->num_var_; local_144 = local_144 + 1) {
    pdVar2 = std::valarray<double>::operator[](&local_48,(long)local_144);
    dVar5 = *pdVar2;
    pdVar2 = std::valarray<double>::operator[](&in_RDI->scaled_lbuser_,(long)local_144);
    if (dVar5 < *pdVar2) {
      pdVar2 = std::valarray<double>::operator[](&local_48,(long)local_144);
      dVar5 = *pdVar2;
      pdVar2 = std::valarray<double>::operator[](&in_RDI->scaled_lbuser_,(long)local_144);
      dVar1 = *pdVar2;
      pdVar2 = std::valarray<double>::operator[](&local_110,(long)local_144);
      *pdVar2 = dVar5 - dVar1;
    }
    pdVar2 = std::valarray<double>::operator[](&local_48,(long)local_144);
    dVar5 = *pdVar2;
    pdVar2 = std::valarray<double>::operator[](&in_RDI->scaled_ubuser_,(long)local_144);
    if (*pdVar2 <= dVar5 && dVar5 != *pdVar2) {
      pdVar2 = std::valarray<double>::operator[](&local_48,(long)local_144);
      dVar5 = *pdVar2;
      pdVar2 = std::valarray<double>::operator[](&in_RDI->scaled_ubuser_,(long)local_144);
      dVar1 = *pdVar2;
      pdVar2 = std::valarray<double>::operator[](&local_110,(long)local_144);
      *pdVar2 = dVar5 - dVar1;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_c0,(long)local_144);
    if ((*pvVar3 != -1) &&
       (pdVar2 = std::valarray<double>::operator[](&local_88,(long)local_144), 0.0 < *pdVar2)) {
      pdVar2 = std::valarray<double>::operator[](&local_88,(long)local_144);
      dVar5 = *pdVar2;
      pdVar2 = std::valarray<double>::operator[](&local_140,(long)local_144);
      *pdVar2 = dVar5;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_c0,(long)local_144);
    if ((*pvVar3 != -2) &&
       (pdVar2 = std::valarray<double>::operator[](&local_88,(long)local_144),
       *pdVar2 <= 0.0 && *pdVar2 != 0.0)) {
      pdVar2 = std::valarray<double>::operator[](&local_88,(long)local_144);
      dVar5 = *pdVar2;
      pdVar2 = std::valarray<double>::operator[](&local_140,(long)local_144);
      *pdVar2 = dVar5;
    }
  }
  for (local_148 = 0; local_148 < in_RDI->num_constr_; local_148 = local_148 + 1) {
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       (&in_RDI->constr_type_,(long)local_148);
    if (*pvVar4 == '<') {
      pdVar2 = std::valarray<double>::operator[](&local_58,(long)local_148);
      if (*pdVar2 <= 0.0 && *pdVar2 != 0.0) {
        pdVar2 = std::valarray<double>::operator[](&local_58,(long)local_148);
        dVar5 = *pdVar2;
        pdVar2 = std::valarray<double>::operator[](&local_120,(long)local_148);
        *pdVar2 = dVar5;
      }
      pdVar2 = std::valarray<double>::operator[](local_78,(long)local_148);
      if (0.0 < *pdVar2) {
        pdVar2 = std::valarray<double>::operator[](local_78,(long)local_148);
        dVar5 = *pdVar2;
        pdVar2 = std::valarray<double>::operator[](&local_130,(long)local_148);
        *pdVar2 = dVar5;
      }
    }
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       (&in_RDI->constr_type_,(long)local_148);
    if (*pvVar4 == '>') {
      pdVar2 = std::valarray<double>::operator[](&local_58,(long)local_148);
      if (0.0 < *pdVar2) {
        pdVar2 = std::valarray<double>::operator[](&local_58,(long)local_148);
        dVar5 = *pdVar2;
        pdVar2 = std::valarray<double>::operator[](&local_120,(long)local_148);
        *pdVar2 = dVar5;
      }
      pdVar2 = std::valarray<double>::operator[](local_78,(long)local_148);
      if (*pdVar2 <= 0.0 && *pdVar2 != 0.0) {
        pdVar2 = std::valarray<double>::operator[](local_78,(long)local_148);
        in_stack_fffffffffffffd28 = (Vector *)*pdVar2;
        in_stack_fffffffffffffd30 =
             (Model *)std::valarray<double>::operator[](&local_130,(long)local_148);
        *(Vector **)in_stack_fffffffffffffd30 = in_stack_fffffffffffffd28;
      }
    }
  }
  ScaleBackBasicSolution
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
             in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  ScaleBackBasicSolution
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
             in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  local_150 = Infnorm(in_stack_fffffffffffffd10);
  local_158 = Infnorm(in_stack_fffffffffffffd10);
  x_00 = (Vector *)std::max<double>(&local_150,&local_158);
  *(size_t *)(local_30 + 0xb0) = x_00->_M_size;
  local_160 = Infnorm(x_00);
  this_00 = (vector<int,_std::allocator<int>_> *)Infnorm(x_00);
  local_168 = this_00;
  pdVar2 = std::max<double>(&local_160,(double *)&local_168);
  *(double *)(local_30 + 0xb8) = *pdVar2;
  *(double *)(local_30 + 0xa8) = local_100;
  std::valarray<double>::~valarray(this_01);
  std::valarray<double>::~valarray(this_01);
  std::valarray<double>::~valarray(this_01);
  std::valarray<double>::~valarray(this_01);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::valarray<double>::~valarray(this_01);
  std::valarray<double>::~valarray(this_01);
  std::valarray<double>::~valarray(this_01);
  std::valarray<double>::~valarray(this_01);
  return;
}

Assistant:

void Model::EvaluateBasicSolution(const Vector& x_solver,
                                  const Vector& y_solver,
                                  const Vector& z_solver,
                                  const std::vector<Int>& basic_status_solver,
                                  Info* info) const {
    const Int m = rows();
    const Int n = cols();
    assert((Int)x_solver.size() == n+m);
    assert((Int)y_solver.size() == m);
    assert((Int)z_solver.size() == n+m);
    assert((Int)basic_status_solver.size() == n+m);

    // Build basic solution to scaled user model.
    Vector x(num_var_);
    Vector slack(num_constr_);
    Vector y(num_constr_);
    Vector z(num_var_);
    std::vector<Int> cbasis(num_constr_);
    std::vector<Int> vbasis(num_var_);
    DualizeBackBasicSolution(x_solver, y_solver, z_solver, x, slack, y, z);
    DualizeBackBasis(basic_status_solver, cbasis, vbasis);
    CorrectScaledBasicSolution(x, slack, y, z, cbasis, vbasis);
    double pobj = Dot(scaled_obj_, x);

    // Build infeasibilities in scaled user model.
    Vector xinfeas(num_var_);
    Vector sinfeas(num_constr_);
    Vector yinfeas(num_constr_);
    Vector zinfeas(num_var_);
    for (Int j = 0; j < num_var_; j++) {
        if (x[j] < scaled_lbuser_[j])
            xinfeas[j] = x[j]-scaled_lbuser_[j];
        if (x[j] > scaled_ubuser_[j])
            xinfeas[j] = x[j]-scaled_ubuser_[j];
        if (vbasis[j] != IPX_nonbasic_lb && z[j] > 0.0)
            zinfeas[j] = z[j];
        if (vbasis[j] != IPX_nonbasic_ub && z[j] < 0.0)
            zinfeas[j] = z[j];
    }
    for (Int i = 0; i < num_constr_; i++) {
        if (constr_type_[i] == '<') {
            if (slack[i] < 0.0)
                sinfeas[i] = slack[i];
            if (y[i] > 0.0)
                yinfeas[i] = y[i];
        }
        if (constr_type_[i] == '>') {
            if (slack[i] > 0.0)
                sinfeas[i] = slack[i];
            if (y[i] < 0.0)
                yinfeas[i] = y[i];
        }
    }

    // Scale back basic solution and infeasibilities.
    ScaleBackBasicSolution(x, slack, y, z);
    ScaleBackBasicSolution(xinfeas, sinfeas, yinfeas, zinfeas);

    info->primal_infeas = std::max(Infnorm(xinfeas), Infnorm(sinfeas));
    info->dual_infeas = std::max(Infnorm(zinfeas), Infnorm(yinfeas));
    info->objval = pobj;
}